

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O0

bool icu_63::number::impl::AffixUtils::hasCurrencySymbols
               (UnicodeString *affixPattern,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  Field FVar4;
  UErrorCode *in_R8;
  AffixTag AVar5;
  AffixUtils *local_40;
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  AffixTag tag;
  UErrorCode *status_local;
  UnicodeString *affixPattern_local;
  
  tag._8_8_ = status;
  iVar3 = UnicodeString::length(affixPattern);
  if (iVar3 == 0) {
    affixPattern_local._7_1_ = false;
  }
  else {
    AffixTag::AffixTag((AffixTag *)local_30);
    do {
      bVar1 = hasNext((AffixTag *)local_30,affixPattern);
      if (!bVar1) {
        return false;
      }
      AVar5._8_8_ = affixPattern;
      AVar5.offset = tag.offset;
      AVar5.codePoint = tag.codePoint;
      AVar5 = nextToken((AffixUtils *)local_30,AVar5,(UnicodeString *)tag._8_8_,in_R8);
      local_40 = AVar5._0_8_;
      local_30 = (undefined1  [8])local_40;
      local_38 = AVar5._8_8_;
      tag.offset = local_38._0_4_;
      tag.codePoint = local_38._4_4_;
      UVar2 = ::U_FAILURE(*(UErrorCode *)tag._8_8_);
      if (UVar2 != '\0') {
        return false;
      }
    } while ((-1 < (long)tag._0_8_) ||
            (FVar4 = getFieldForType(tag.codePoint), FVar4 != UNUM_CURRENCY_FIELD));
    affixPattern_local._7_1_ = true;
  }
  return affixPattern_local._7_1_;
}

Assistant:

bool AffixUtils::hasCurrencySymbols(const UnicodeString &affixPattern, UErrorCode &status) {
    if (affixPattern.length() == 0) {
        return false;
    }
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return false; }
        if (tag.type < 0 && getFieldForType(tag.type) == UNUM_CURRENCY_FIELD) {
            return true;
        }
    }
    return false;
}